

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void ucnv_cbFromUWriteSub_63(UConverterFromUnicodeArgs *args,int32_t offsetIndex,UErrorCode *err)

{
  char cVar1;
  UConverter *pUVar2;
  UConverterWriteSub UNRECOVERED_JUMPTABLE;
  UChar *source;
  
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    pUVar2 = args->converter;
    cVar1 = pUVar2->subCharLen;
    if (cVar1 != '\0') {
      if (cVar1 < '\0') {
        source = (UChar *)pUVar2->subChars;
        ucnv_cbFromUWriteUChars_63(args,&source,source + -(long)(int)cVar1,offsetIndex,err);
        return;
      }
      UNRECOVERED_JUMPTABLE = pUVar2->sharedData->impl->writeSub;
      if (UNRECOVERED_JUMPTABLE != (UConverterWriteSub)0x0) {
        (*UNRECOVERED_JUMPTABLE)(args,offsetIndex,err);
        return;
      }
      if ((pUVar2->subChar1 != '\0') && ((ushort)pUVar2->invalidUCharBuffer[0] < 0x100)) {
        source = (UChar *)0x1;
        ucnv_cbFromUWriteBytes_63(args,(char *)&pUVar2->subChar1,1,offsetIndex,err);
        return;
      }
      ucnv_cbFromUWriteBytes_63(args,(char *)pUVar2->subChars,(int)cVar1,offsetIndex,err);
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }